

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcServiceLife::IfcServiceLife(IfcServiceLife *this)

{
  IfcServiceLife *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x118,"IfcServiceLife");
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__00e97ba0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>,
             &PTR_construction_vtable_24__00e97c50);
  *(undefined8 *)this = 0xe97ac0;
  *(undefined8 *)&this->field_0x118 = 0xe97b88;
  *(undefined8 *)&this->field_0x88 = 0xe97ae8;
  *(undefined8 *)&this->field_0x98 = 0xe97b10;
  *(undefined8 *)&this->field_0xd0 = 0xe97b38;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0xe97b60;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).field_0x10);
  return;
}

Assistant:

IfcServiceLife() : Object("IfcServiceLife") {}